

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

bool __thiscall
TCMallocImplementation::SetNumericProperty(TCMallocImplementation *this,char *name,size_t value)

{
  int iVar1;
  MallocExtension *pMVar2;
  SpinLockHolder local_20;
  SpinLockHolder l;
  
  iVar1 = strcmp(name,"tcmalloc.max_total_thread_cache_bytes");
  if (iVar1 == 0) {
    local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    tcmalloc::ThreadCache::set_overall_thread_cache_size(value);
  }
  else {
    iVar1 = strcmp(name,"tcmalloc.min_per_thread_cache_bytes");
    if (iVar1 == 0) {
      tcmalloc::ThreadCache::min_per_thread_cache_size_ = value;
      return true;
    }
    iVar1 = strcmp(name,"tcmalloc.aggressive_memory_decommit");
    if (iVar1 == 0) {
      local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
      SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
      tcmalloc::Static::pageheap_[0x1830dc] = value != 0;
    }
    else {
      iVar1 = strcmp(name,"tcmalloc.heap_limit_mb");
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"tcmalloc.sample_parameter");
        if (iVar1 == 0) {
          FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
          FLAGS_tcmalloc_sample_parameter = value;
          pMVar2 = MallocExtension::instance();
          (*pMVar2->_vptr_MallocExtension[0xd])(pMVar2);
          return true;
        }
        return false;
      }
      local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
      SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
      FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::FLAGS_tcmalloc_heap_limit_mb
           = value;
    }
  }
  SpinLockHolder::~SpinLockHolder(&local_20);
  return true;
}

Assistant:

virtual bool SetNumericProperty(const char* name, size_t value) {
    ASSERT(name != nullptr);

    if (strcmp(name, "tcmalloc.max_total_thread_cache_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      ThreadCache::set_overall_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.min_per_thread_cache_bytes") == 0) {
      ThreadCache::set_min_per_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.aggressive_memory_decommit") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      Static::pageheap()->SetAggressiveDecommit(value != 0);
      return true;
    }

    if (strcmp(name, "tcmalloc.heap_limit_mb") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      FLAGS_tcmalloc_heap_limit_mb = value;
      return true;
    }

    if (strcmp(name, "tcmalloc.sample_parameter") == 0) {
      FLAGS_tcmalloc_sample_parameter = value;
      // By clearing current thread's cache we force next allocations
      // to read freshly updated sample parameter. This is only going
      // to affect current thread, but this is better than nothing.
      MallocExtension::instance()->MarkThreadIdle();
      return true;
    }

    return false;
  }